

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O2

int __thiscall
mailManager::listMail
          (mailManager *this,
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map1)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  string temp;
  undefined1 local_58 [40];
  
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(this->map)._M_t);
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = '\0';
  mailSocket::sendData(this->socket,"stat\r\n");
  pcVar2 = this->recvData;
  mailSocket::recvData(this->socket,pcVar2,0x400);
  mailSocket::sendData(this->socket,"list\r\n");
  mailSocket::recvData(this->socket,pcVar2,0x400);
  pcVar2 = strtok(pcVar2,"\r\n");
  if (pcVar2 != (char *)0x0) {
    iVar3 = 1;
    while( true ) {
      pcVar2 = strtok((char *)0x0,"\r\n");
      if (*pcVar2 == '.') break;
      std::__cxx11::string::assign((char *)&temp);
      local_58._0_4_ = iVar3;
      std::__cxx11::string::string((string *)(local_58 + 8),(string *)&temp);
      std::
      _Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
      ::_M_emplace_unique<std::pair<int,std::__cxx11::string>>
                ((_Rb_tree<int,std::pair<int_const,std::__cxx11::string>,std::_Select1st<std::pair<int_const,std::__cxx11::string>>,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                  *)map1,(pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      iVar3 = iVar3 + 1;
    }
  }
  sVar1 = (map1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::~string((string *)&temp);
  return (int)sVar1;
}

Assistant:

int mailManager::listMail(std::map<int, string> *map1) {
    map.clear();
    string temp;
    char *p;
    int i = 0;

    socket->sendData("stat\r\n");
    socket->recvData(recvData, BUF_SIZE);

    socket->sendData("list\r\n");
    socket->recvData(recvData, BUF_SIZE);

    p = strtok(recvData, "\r\n");
    while (p) {
        i++;
        p = strtok(nullptr, "\r\n");
        if (*p == '.') {
            break;
        }
        temp = p;
        map1->insert(pair<int, string>(i, temp));
        //TODO 杨旭的任务：这里是得到的列表，使用top能够得到邮件的头部信息，解码存放到map1中
//        socket->sendData("top 1");

    }

    return (int) map1->size();
}